

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

void __thiscall Fl_Pixmap::copy_data(Fl_Pixmap *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  int local_2c;
  int chars_per_line;
  int chars_per_pixel;
  int ncolors;
  int i;
  char **new_row;
  char **new_data;
  Fl_Pixmap *this_local;
  
  if (this->alloc_data == 0) {
    new_data = (char **)this;
    ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
    __isoc99_sscanf(*ppcVar6,"%*d%*d%d%d",&chars_per_line,&local_2c);
    iVar3 = Fl_Image::w(&this->super_Fl_Image);
    iVar3 = local_2c * iVar3 + 1;
    if (chars_per_line < 0) {
      iVar4 = Fl_Image::h(&this->super_Fl_Image);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(iVar4 + 2);
      uVar7 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      new_row = (char **)operator_new__(uVar7);
    }
    else {
      iVar4 = Fl_Image::h(&this->super_Fl_Image);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(iVar4 + chars_per_line + 1);
      uVar7 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      new_row = (char **)operator_new__(uVar7);
    }
    ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
    sVar8 = strlen(*ppcVar6);
    pcVar9 = (char *)operator_new__(sVar8 + 1);
    *new_row = pcVar9;
    pcVar9 = *new_row;
    ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
    strcpy(pcVar9,*ppcVar6);
    if (chars_per_line < 0) {
      _ncolors = new_row + 1;
      iVar4 = chars_per_line * -4;
      chars_per_line = -chars_per_line;
      pcVar9 = (char *)operator_new__((long)iVar4);
      *_ncolors = pcVar9;
      pcVar9 = *_ncolors;
      ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
      memcpy(pcVar9,ppcVar6[1],(long)(chars_per_line << 2));
      chars_per_line = 1;
      _ncolors = _ncolors + 1;
    }
    else {
      _ncolors = new_row;
      for (chars_per_pixel = 0; _ncolors = _ncolors + 1, chars_per_pixel < chars_per_line;
          chars_per_pixel = chars_per_pixel + 1) {
        ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
        sVar8 = strlen(ppcVar6[chars_per_pixel + 1]);
        pcVar9 = (char *)operator_new__(sVar8 + 1);
        *_ncolors = pcVar9;
        pcVar9 = *_ncolors;
        ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
        strcpy(pcVar9,ppcVar6[chars_per_pixel + 1]);
      }
    }
    for (chars_per_pixel = 0; iVar4 = chars_per_pixel, iVar5 = Fl_Image::h(&this->super_Fl_Image),
        ppcVar6 = new_row, iVar4 < iVar5; chars_per_pixel = chars_per_pixel + 1) {
      pcVar9 = (char *)operator_new__((long)iVar3);
      *_ncolors = pcVar9;
      pcVar9 = *_ncolors;
      ppcVar6 = Fl_Image::data(&this->super_Fl_Image);
      memcpy(pcVar9,ppcVar6[chars_per_pixel + chars_per_line + 1],(long)iVar3);
      _ncolors = _ncolors + 1;
    }
    iVar3 = Fl_Image::h(&this->super_Fl_Image);
    Fl_Image::data(&this->super_Fl_Image,ppcVar6,iVar3 + chars_per_line + 1);
    this->alloc_data = 1;
  }
  return;
}

Assistant:

void Fl_Pixmap::copy_data() {
  if (alloc_data) return;

  char		**new_data,	// New data array
		**new_row;	// Current row in image
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * w() + 1;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[h() + 2];
  else new_data = new char *[h() + ncolors + 1];

  new_data[0] = new char[strlen(data()[0]) + 1];
  strcpy(new_data[0], data()[0]);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Copy image data...
  for (i = 0; i < h(); i ++, new_row ++) {
    *new_row = new char[chars_per_line];
    memcpy(*new_row, data()[i + ncolors + 1], chars_per_line);
  }

  // Update pointers...
  data((const char **)new_data, h() + ncolors + 1);
  alloc_data = 1;
}